

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

idx_t duckdb::UncompressedStringStorage::FinalizeAppend
                (ColumnSegment *segment,SegmentStatistics *param_2)

{
  uint uVar1;
  uint uVar2;
  __int_type _Var3;
  BlockManager *pBVar4;
  data_ptr_t pdVar5;
  undefined1 auVar6 [16];
  BufferManager *pBVar7;
  BlockHandle *pBVar8;
  idx_t iVar9;
  idx_t iVar10;
  ulong __n;
  BufferHandle handle;
  BufferHandle local_50;
  idx_t local_38;
  
  pBVar7 = BufferManager::GetBufferManager(segment->db);
  (*pBVar7->_vptr_BufferManager[7])(&local_50,pBVar7,&segment->block);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_50.node);
  uVar1 = *(uint *)((local_50.node.ptr)->buffer + segment->offset);
  __n = (ulong)uVar1;
  uVar2 = *(uint *)((local_50.node.ptr)->buffer + segment->offset + 4);
  _Var3 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  pBVar8 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  pBVar4 = pBVar8->block_manager;
  iVar9 = optional_idx::GetIndex(&pBVar4->block_alloc_size);
  iVar10 = optional_idx::GetIndex(&pBVar4->block_header_size);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = iVar9 - iVar10;
  iVar9 = __n + _Var3 * 4 + 8;
  if (iVar9 < (SUB168(auVar6 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc)) {
    local_38 = ColumnSegment::SegmentSize(segment);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_50.node);
    memmove((local_50.node.ptr)->buffer + _Var3 * 4 + 8,(local_50.node.ptr)->buffer + (uVar2 - __n),
            __n);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_50.node);
    pdVar5 = (local_50.node.ptr)->buffer;
    iVar10 = segment->offset;
    *(uint *)(pdVar5 + iVar10) = uVar1;
    *(uint *)(pdVar5 + iVar10 + 4) = ((int)iVar9 - (int)local_38) + uVar2;
  }
  else {
    iVar9 = ColumnSegment::SegmentSize(segment);
  }
  BufferHandle::~BufferHandle(&local_50);
  return iVar9;
}

Assistant:

idx_t UncompressedStringStorage::FinalizeAppend(ColumnSegment &segment, SegmentStatistics &) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	auto dict = GetDictionary(segment, handle);
	D_ASSERT(dict.end == segment.SegmentSize());
	// compute the total size required to store this segment
	auto offset_size = DICTIONARY_HEADER_SIZE + segment.count * sizeof(int32_t);
	auto total_size = offset_size + dict.size;

	CompressionInfo info(segment.GetBlockManager());
	if (total_size >= info.GetCompactionFlushLimit()) {
		// the block is full enough, don't bother moving around the dictionary
		return segment.SegmentSize();
	}

	// the block has space left: figure out how much space we can save
	auto move_amount = segment.SegmentSize() - total_size;
	// move the dictionary so it lines up exactly with the offsets
	auto dataptr = handle.Ptr();
	memmove(dataptr + offset_size, dataptr + dict.end - dict.size, dict.size);
	dict.end -= move_amount;
	D_ASSERT(dict.end == total_size);
	// write the new dictionary (with the updated "end")
	SetDictionary(segment, handle, dict);
	return total_size;
}